

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

void __thiscall HawkTracer::parser::ProtocolReader::wait_for_complete(ProtocolReader *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> l;
  ProtocolReader *this_local;
  
  l._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_mtx_cv);
  std::condition_variable::wait<HawkTracer::parser::ProtocolReader::wait_for_complete()::__0>
            (&this->_cv,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void ProtocolReader::wait_for_complete()
{
    std::unique_lock<std::mutex> l(_mtx_cv);
    _cv.wait(l, [this] { return !_is_running; });
}